

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

int util::to_int(string *subject)

{
  int iVar1;
  undefined1 auStack_48 [64];
  
  variant::variant((variant *)auStack_48,subject);
  iVar1 = variant::GetInt((variant *)auStack_48);
  std::__cxx11::string::~string((string *)(auStack_48 + 0x10));
  return iVar1;
}

Assistant:

int to_int(const std::string &subject)
{
	return static_cast<int>(util::variant(subject));
}